

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O3

void cmQtAutoGeneratorInitializer::SetupAutoGenerateTarget(cmGeneratorTarget *target)

{
  const_iterator __position;
  cmSourceFile *pcVar1;
  cmMakefile *this;
  pointer pcVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  PolicyStatus PVar8;
  FileFormat FVar9;
  undefined4 uVar10;
  cmGlobalGenerator *pcVar11;
  mapped_type *pmVar12;
  undefined4 extraout_var;
  string *psVar13;
  char *pcVar14;
  cmMakefile *pcVar15;
  cmGeneratorTarget *pcVar16;
  size_t sVar17;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var18;
  char *pcVar19;
  char **ppcVar20;
  ostream *poVar21;
  _Base_ptr p_Var22;
  PolicyID id;
  pointer pbVar23;
  byte bVar24;
  char cVar25;
  _Alloc_hider _Var26;
  cmMakefile *pcVar27;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  pointer ppcVar29;
  value_type *__x;
  pointer __v;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar30;
  string infoFile;
  size_type __dnew_3;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uiFileFiles;
  string cfg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> uiFilesWithOptions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uiFileOptions;
  string qtMajorVersion;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uicSkipList;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcFiles_1;
  string config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rccFileFiles;
  string autogenTargetName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mocSkipList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headers;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rccOptionsTarget;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rccFileOptions;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configUicOptions;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configMocDefines;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configMocIncludes;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configSuffix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  cmGeneratorTarget *local_570;
  undefined1 local_568 [45];
  char local_53b;
  byte local_53a;
  char local_539;
  string local_538;
  undefined1 local_518 [40];
  cmMakefile *local_4f0;
  cmMakefile *local_4e8;
  cmMakefile *local_4e0;
  undefined1 local_4d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  _Base_ptr local_4b8;
  size_t local_4b0;
  ios_base local_468 [136];
  ios_base local_3e0 [264];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  cmNewLineStyle local_254;
  string local_250;
  undefined8 local_230;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_208;
  string local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  string local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  pcVar27 = target->Target->Makefile;
  local_570 = target;
  cmMakefile::PushScope(pcVar27);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
  local_4e0 = pcVar27;
  cmMakefile::GetConfigurations((string *)local_4d8,pcVar27,&local_2d8,true);
  std::__cxx11::string::_M_assign((string *)&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._0_8_ != &local_4c8) {
    operator_delete((void *)local_4d8._0_8_,
                    CONCAT17(local_4c8._M_local_buf[7],
                             CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                      CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                               local_4c8._M_local_buf[0]))) + 1);
  }
  if (local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_4d8._8_8_ = (char *)0x0;
    local_4c8._M_local_buf[0] = '\0';
    local_4d8._0_8_ = &local_4c8;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ != &local_4c8) {
      operator_delete((void *)local_4d8._0_8_,
                      CONCAT17(local_4c8._M_local_buf[7],
                               CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                        CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                 local_4c8._M_local_buf[0]))) + 1);
    }
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f0._M_impl.super__Rb_tree_header._M_header;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  pcVar11 = cmGeneratorTarget::GetGlobalGenerator(local_570);
  iVar7 = (*pcVar11->_vptr_cmGlobalGenerator[0x1f])(pcVar11);
  if (((char)iVar7 != '\0') &&
     (local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    pbVar23 = local_2d8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::operator+(&local_590,"_",pbVar23);
      cmOutputConverter::EscapeForCMake((string *)local_4d8,&local_590);
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_60,pbVar23);
      std::__cxx11::string::operator=((string *)pmVar12,(string *)local_4d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._0_8_ != &local_4c8) {
        operator_delete((void *)local_4d8._0_8_,
                        CONCAT17(local_4c8._M_local_buf[7],
                                 CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                          CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                   local_4c8._M_local_buf[0]))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_590._M_dataplus._M_p != &local_590.field_2) {
        operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
      }
      pbVar23 = pbVar23 + 1;
    } while (pbVar23 !=
             local_2d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_4d8._0_8_ = &local_4c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"AUTOMOC","");
  bVar4 = cmGeneratorTarget::GetPropertyAsBool(local_570,(string *)local_4d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._0_8_ != &local_4c8) {
    operator_delete((void *)local_4d8._0_8_,
                    CONCAT17(local_4c8._M_local_buf[7],
                             CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                      CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                               local_4c8._M_local_buf[0]))) + 1);
  }
  local_4d8._0_8_ = &local_4c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"AUTOUIC","");
  bVar5 = cmGeneratorTarget::GetPropertyAsBool(local_570,(string *)local_4d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._0_8_ != &local_4c8) {
    operator_delete((void *)local_4d8._0_8_,
                    CONCAT17(local_4c8._M_local_buf[7],
                             CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                      CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                               local_4c8._M_local_buf[0]))) + 1);
  }
  local_4d8._0_8_ = &local_4c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"AUTORCC","");
  local_53a = cmGeneratorTarget::GetPropertyAsBool(local_570,(string *)local_4d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._0_8_ != &local_4c8) {
    operator_delete((void *)local_4d8._0_8_,
                    CONCAT17(local_4c8._M_local_buf[7],
                             CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                      CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                               local_4c8._M_local_buf[0]))) + 1);
  }
  pcVar16 = local_570;
  GetAutogenTargetName_abi_cxx11_(&local_1a8,local_570);
  GetQtMajorVersion_abi_cxx11_(&local_250,pcVar16);
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (((bVar4 || bVar5) | local_53a) != 1) goto LAB_002fa2ed;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_4c8._M_local_buf[0] = 'A';
  local_4c8._M_allocated_capacity._1_2_ = 0x5455;
  local_4c8._M_allocated_capacity._3_4_ = 0x434f4d4f;
  local_4d8._8_8_ = 7;
  local_4c8._M_local_buf[7] = '\0';
  local_4d8._0_8_ = &local_4c8;
  bVar6 = cmGeneratorTarget::GetPropertyAsBool(local_570,(string *)local_4d8);
  local_4f0 = (cmMakefile *)CONCAT71(local_4f0._1_7_,bVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._0_8_ != &local_4c8) {
    operator_delete((void *)local_4d8._0_8_,
                    CONCAT17(local_4c8._M_local_buf[7],
                             CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                      CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                               local_4c8._M_local_buf[0]))) + 1);
  }
  local_4c8._M_local_buf[0] = 'A';
  local_4c8._M_allocated_capacity._1_2_ = 0x5455;
  local_4c8._M_allocated_capacity._3_4_ = 0x4349554f;
  local_4d8._8_8_ = (char *)0x7;
  local_4c8._M_local_buf[7] = '\0';
  local_4d8._0_8_ = &local_4c8;
  bVar6 = cmGeneratorTarget::GetPropertyAsBool(local_570,(string *)local_4d8);
  local_4e8 = (cmMakefile *)CONCAT71(local_4e8._1_7_,bVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._0_8_ != &local_4c8) {
    operator_delete((void *)local_4d8._0_8_,
                    CONCAT17(local_4c8._M_local_buf[7],
                             CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                      CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                               local_4c8._M_local_buf[0]))) + 1);
  }
  pcVar16 = local_570;
  PVar8 = cmMakefile::GetPolicyStatus(local_570->Makefile,CMP0071);
  local_230 = CONCAT44(extraout_var,PVar8);
  local_538._M_dataplus._M_p = (pointer)0x0;
  local_538._M_string_length = 0;
  local_538.field_2._M_local_buf[0] = '\0';
  local_538.field_2._M_local_buf[1] = '\0';
  local_538.field_2._M_allocated_capacity._2_5_ = 0;
  local_538.field_2._M_local_buf[7] = '\0';
  local_53b = bVar5;
  local_539 = bVar4;
  cmGeneratorTarget::GetConfigCommonSourceFiles
            (pcVar16,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_538);
  _Var26._M_p = local_538._M_dataplus._M_p;
  if (local_538._M_dataplus._M_p != (pointer)local_538._M_string_length) {
    do {
      pcVar1 = *(cmSourceFile **)_Var26._M_p;
      psVar13 = cmSourceFile::GetExtension_abi_cxx11_(pcVar1);
      FVar9 = cmSystemTools::GetFileFormat((psVar13->_M_dataplus)._M_p);
      if ((FVar9 == CXX_FILE_FORMAT) || (FVar9 == HEADER_FILE_FORMAT)) {
        psVar13 = cmSourceFile::GetFullPath(pcVar1,(string *)0x0);
        cmsys::SystemTools::GetRealPath(&local_590,psVar13,(string *)0x0);
        local_4d8._0_8_ = &local_4c8;
        local_4c8._M_local_buf[0] = 'S';
        local_4c8._M_allocated_capacity._1_2_ = 0x494b;
        local_4c8._M_allocated_capacity._3_4_ = 0x55415f50;
        local_4c8._M_local_buf[7] = 'T';
        local_4c8._M_local_buf[8] = 'O';
        local_4c8._M_local_buf[9] = 'G';
        local_4c8._10_2_ = 0x4e45;
        local_4d8._8_8_ = (char *)0xc;
        local_4c8._M_local_buf[0xc] = '\0';
        pcVar14 = cmSourceFile::GetPropertyForUser(pcVar1,(string *)local_4d8);
        bVar4 = cmSystemTools::IsOn(pcVar14);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8._0_8_ != &local_4c8) {
          operator_delete((void *)local_4d8._0_8_,
                          CONCAT17(local_4c8._M_local_buf[7],
                                   CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                            CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                     local_4c8._M_local_buf[0]))) + 1);
        }
        if (bVar4) {
          bVar5 = true;
          bVar24 = 0;
LAB_002f85fc:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_188,&local_590);
LAB_002f860e:
          if (bVar5 != false) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_228,&local_590);
          }
          if (bVar24 != 0) {
            this_00 = &local_148;
            if (FVar9 != CXX_FILE_FORMAT) {
              if (FVar9 != HEADER_FILE_FORMAT) goto LAB_002f8650;
              this_00 = &local_168;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(this_00,&local_590);
          }
        }
        else {
          local_4d8._0_8_ = &local_4c8;
          local_4c8._M_local_buf[0] = 'S';
          local_4c8._M_allocated_capacity._1_2_ = 0x494b;
          local_4c8._M_allocated_capacity._3_4_ = 0x55415f50;
          local_4c8._M_local_buf[7] = 'T';
          local_4c8._M_local_buf[8] = 'O';
          local_4c8._M_local_buf[9] = 'M';
          local_4c8._10_2_ = 0x434f;
          local_4d8._8_8_ = 0xc;
          local_4c8._M_local_buf[0xc] = '\0';
          pcVar14 = cmSourceFile::GetPropertyForUser(pcVar1,(string *)local_4d8);
          bVar4 = cmSystemTools::IsOn(pcVar14);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._0_8_ != &local_4c8) {
            operator_delete((void *)local_4d8._0_8_,
                            CONCAT17(local_4c8._M_local_buf[7],
                                     CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                              CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                       local_4c8._M_local_buf[0]))) + 1);
          }
          local_4d8._0_8_ = &local_4c8;
          local_4c8._M_local_buf[0] = 'S';
          local_4c8._M_allocated_capacity._1_2_ = 0x494b;
          local_4c8._M_allocated_capacity._3_4_ = 0x55415f50;
          local_4c8._M_local_buf[7] = 'T';
          local_4c8._M_local_buf[8] = 'O';
          local_4c8._M_local_buf[9] = 'U';
          local_4c8._10_2_ = 0x4349;
          local_4d8._8_8_ = (char *)0xc;
          local_4c8._M_local_buf[0xc] = '\0';
          pcVar14 = cmSourceFile::GetPropertyForUser(pcVar1,(string *)local_4d8);
          bVar5 = cmSystemTools::IsOn(pcVar14);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._0_8_ != &local_4c8) {
            operator_delete((void *)local_4d8._0_8_,
                            CONCAT17(local_4c8._M_local_buf[7],
                                     CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                              CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                       local_4c8._M_local_buf[0]))) + 1);
          }
          bVar24 = !bVar5 & (byte)local_4e8 | !bVar4 & (byte)local_4f0;
          if (bVar24 != 1) {
LAB_002f85f8:
            if (bVar4) goto LAB_002f85fc;
            goto LAB_002f860e;
          }
          local_4d8._0_8_ = &local_4c8;
          local_4c8._M_local_buf[0] = 'G';
          local_4c8._M_allocated_capacity._1_2_ = 0x4e45;
          local_4c8._M_allocated_capacity._3_4_ = 0x54415245;
          local_4c8._M_local_buf[7] = 'E';
          local_4c8._M_local_buf[8] = 'D';
          local_4d8._8_8_ = (char *)0x9;
          local_4c8._M_local_buf[9] = '\0';
          pcVar14 = cmSourceFile::GetPropertyForUser(pcVar1,(string *)local_4d8);
          bVar6 = cmSystemTools::IsOn(pcVar14);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._0_8_ != &local_4c8) {
            operator_delete((void *)local_4d8._0_8_,
                            CONCAT17(local_4c8._M_local_buf[7],
                                     CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                              CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                       local_4c8._M_local_buf[0]))) + 1);
          }
          if ((!bVar6) || ((int)local_230 - 2U < 3)) goto LAB_002f85f8;
          if ((int)local_230 == 1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d8);
            cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_568,(cmPolicies *)0x47,id);
            poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4d8,(char *)local_568._0_8_,local_568._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\n",1);
            if ((string *)local_568._0_8_ != (string *)(local_568 + 0x10)) {
              operator_delete((void *)local_568._0_8_,local_568._16_8_ + 1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4d8,"AUTOMOC/AUTOUIC: Ignoring GENERATED source file:\n",
                       0x31);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d8,"  ",2);
            cmQtAutoGeneratorCommon::Quoted((string *)local_568,&local_590);
            poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4d8,(char *)local_568._0_8_,local_568._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\n",1);
            if ((string *)local_568._0_8_ != (string *)(local_568 + 0x10)) {
              operator_delete((void *)local_568._0_8_,local_568._16_8_ + 1);
            }
            pcVar27 = local_570->Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar27,AUTHOR_WARNING,(string *)local_568);
            if ((string *)local_568._0_8_ != (string *)(local_568 + 0x10)) {
              operator_delete((void *)local_568._0_8_,local_568._16_8_ + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d8);
            std::ios_base::~ios_base(local_468);
          }
        }
LAB_002f8650:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_590._M_dataplus._M_p != &local_590.field_2) {
          operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
        }
      }
      _Var26._M_p = _Var26._M_p + 8;
    } while (_Var26._M_p != (pointer)local_538._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_538._M_dataplus._M_p,
                    CONCAT17(local_538.field_2._M_local_buf[7],
                             CONCAT52(local_538.field_2._M_allocated_capacity._2_5_,
                                      CONCAT11(local_538.field_2._M_local_buf[1],
                                               local_538.field_2._M_local_buf[0]))) -
                    (long)local_538._M_dataplus._M_p);
  }
  pcVar16 = local_570;
  cVar25 = local_53b;
  if (local_539 != '\0') {
    pcVar15 = (cmMakefile *)cmGeneratorTarget::GetLocalGenerator(local_570);
    pcVar27 = pcVar16->Target->Makefile;
    GetSafeProperty_abi_cxx11_((string *)local_4d8,pcVar16,"AUTOMOC_MOC_OPTIONS");
    AddDefinitionEscaped(pcVar27,"_moc_options",(string *)local_4d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ != &local_4c8) {
      operator_delete((void *)local_4d8._0_8_,
                      CONCAT17(local_4c8._M_local_buf[7],
                               CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                        CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                 local_4c8._M_local_buf[0]))) + 1);
    }
    AddDefinitionEscaped(pcVar27,"_moc_skip",&local_188);
    local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_590,"CMAKE_AUTOMOC_RELAXED_MODE","");
    bVar4 = cmMakefile::IsOn(pcVar27,&local_590);
    pcVar14 = "FALSE";
    if (bVar4) {
      pcVar14 = "TRUE";
    }
    local_4d8._0_8_ = &local_4c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4d8,pcVar14,pcVar14 + ((ulong)bVar4 ^ 5));
    AddDefinitionEscaped(pcVar27,"_moc_relaxed_mode",(string *)local_4d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ != &local_4c8) {
      operator_delete((void *)local_4d8._0_8_,
                      CONCAT17(local_4c8._M_local_buf[7],
                               CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                        CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                 local_4c8._M_local_buf[0]))) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._M_dataplus._M_p != &local_590.field_2) {
      operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
    }
    GetSafeProperty_abi_cxx11_((string *)local_4d8,local_570,"AUTOMOC_DEPEND_FILTERS");
    AddDefinitionEscaped(pcVar27,"_moc_depend_filters",(string *)local_4d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ != &local_4c8) {
      operator_delete((void *)local_4d8._0_8_,
                      CONCAT17(local_4c8._M_local_buf[7],
                               CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                        CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                 local_4c8._M_local_buf[0]))) + 1);
    }
    this = local_570->Target->Makefile;
    local_568._0_8_ = local_568 + 0x10;
    local_568._8_8_ = (string *)0x0;
    local_568._16_8_ = local_568._16_8_ & 0xffffffffffffff00;
    iVar7 = std::__cxx11::string::compare((char *)&local_250);
    if (iVar7 == 0) {
      local_4d8._0_8_ = &local_4c8;
      local_590._M_dataplus._M_p = (char *)0x15;
      local_4d8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_4d8,(ulong)&local_590);
      local_4c8._M_local_buf[0] = (char)local_590._M_dataplus._M_p;
      local_4c8._M_allocated_capacity._1_2_ = (undefined2)((ulong)local_590._M_dataplus._M_p >> 8);
      local_4c8._M_allocated_capacity._3_4_ =
           (undefined4)((ulong)local_590._M_dataplus._M_p >> 0x18);
      local_4c8._M_local_buf[7] = (char)((ulong)local_590._M_dataplus._M_p >> 0x38);
      *(undefined8 *)local_4d8._0_8_ = 0x5f65726f43357451;
      *(char *)(local_4d8._0_8_ + 8) = 'V';
      *(char *)(local_4d8._0_8_ + 9) = 'E';
      *(char *)(local_4d8._0_8_ + 10) = 'R';
      *(char *)(local_4d8._0_8_ + 0xb) = 'S';
      *(char *)(local_4d8._0_8_ + 0xc) = 'I';
      *(char *)(local_4d8._0_8_ + 0xd) = 'O';
      *(char *)(local_4d8._0_8_ + 0xe) = 'N';
      *(char *)(local_4d8._0_8_ + 0xf) = '_';
      *(char *)(local_4d8._0_8_ + 0xd) = 'O';
      *(char *)(local_4d8._0_8_ + 0xe) = 'N';
      *(char *)(local_4d8._0_8_ + 0xf) = '_';
      *(char *)(local_4d8._0_8_ + 0x10) = 'M';
      *(char *)(local_4d8._0_8_ + 0x11) = 'I';
      *(char *)(local_4d8._0_8_ + 0x12) = 'N';
      *(char *)(local_4d8._0_8_ + 0x13) = 'O';
      *(char *)(local_4d8._0_8_ + 0x14) = 'R';
      local_4d8._8_8_ = local_590._M_dataplus._M_p;
      *(char *)(local_4d8._0_8_ + (long)local_590._M_dataplus._M_p) = '\0';
      pcVar14 = cmMakefile::GetSafeDefinition(this,(string *)local_4d8);
      uVar3 = local_568._8_8_;
      strlen(pcVar14);
      std::__cxx11::string::_M_replace((ulong)local_568,0,(char *)uVar3,(ulong)pcVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._0_8_ != &local_4c8) {
        operator_delete((void *)local_4d8._0_8_,
                        CONCAT17(local_4c8._M_local_buf[7],
                                 CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                          CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                   local_4c8._M_local_buf[0]))) + 1);
      }
    }
    if ((string *)local_568._8_8_ == (string *)0x0) {
      local_4d8._0_8_ = &local_4c8;
      local_590._M_dataplus._M_p = (char *)0x10;
      local_4d8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_4d8,(ulong)&local_590);
      local_4c8._M_local_buf[0] = (char)local_590._M_dataplus._M_p;
      local_4c8._M_allocated_capacity._1_2_ = (undefined2)((ulong)local_590._M_dataplus._M_p >> 8);
      local_4c8._M_allocated_capacity._3_4_ =
           (undefined4)((ulong)local_590._M_dataplus._M_p >> 0x18);
      local_4c8._M_local_buf[7] = (char)((ulong)local_590._M_dataplus._M_p >> 0x38);
      *(undefined8 *)local_4d8._0_8_ = 0x49535245565f5451;
      *(char *)(local_4d8._0_8_ + 8) = 'O';
      *(char *)(local_4d8._0_8_ + 9) = 'N';
      *(char *)(local_4d8._0_8_ + 10) = '_';
      *(char *)(local_4d8._0_8_ + 0xb) = 'M';
      *(char *)(local_4d8._0_8_ + 0xc) = 'I';
      *(char *)(local_4d8._0_8_ + 0xd) = 'N';
      *(char *)(local_4d8._0_8_ + 0xe) = 'O';
      *(char *)(local_4d8._0_8_ + 0xf) = 'R';
      local_4d8._8_8_ = local_590._M_dataplus._M_p;
      *(char *)(local_4d8._0_8_ + (long)local_590._M_dataplus._M_p) = '\0';
      pcVar14 = cmMakefile::GetSafeDefinition(this,(string *)local_4d8);
      uVar3 = local_568._8_8_;
      strlen(pcVar14);
      std::__cxx11::string::_M_replace((ulong)local_568,0,(char *)uVar3,(ulong)pcVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._0_8_ != &local_4c8) {
        operator_delete((void *)local_4d8._0_8_,
                        CONCAT17(local_4c8._M_local_buf[7],
                                 CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                          CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                   local_4c8._M_local_buf[0]))) + 1);
      }
    }
    local_4d8._0_8_ = &local_4c8;
    local_590._M_dataplus._M_p = (pointer)0x10;
    local_4d8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_4d8,(ulong)&local_590);
    local_4c8._M_local_buf[0] = (char)local_590._M_dataplus._M_p;
    local_4c8._M_allocated_capacity._1_2_ = (undefined2)((ulong)local_590._M_dataplus._M_p >> 8);
    local_4c8._M_allocated_capacity._3_4_ = (undefined4)((ulong)local_590._M_dataplus._M_p >> 0x18);
    local_4c8._M_local_buf[7] = (char)((ulong)local_590._M_dataplus._M_p >> 0x38);
    *(undefined8 *)local_4d8._0_8_ = 0x524f4e494d5f5451;
    *(char *)(local_4d8._0_8_ + 8) = '_';
    *(char *)(local_4d8._0_8_ + 9) = 'V';
    *(char *)(local_4d8._0_8_ + 10) = 'E';
    *(char *)(local_4d8._0_8_ + 0xb) = 'R';
    *(char *)(local_4d8._0_8_ + 0xc) = 'S';
    *(char *)(local_4d8._0_8_ + 0xd) = 'I';
    *(char *)(local_4d8._0_8_ + 0xe) = 'O';
    *(char *)(local_4d8._0_8_ + 0xf) = 'N';
    local_4d8._8_8_ = local_590._M_dataplus._M_p;
    *(char *)(local_4d8._0_8_ + (long)local_590._M_dataplus._M_p) = '\0';
    local_590._M_string_length = 0;
    local_590.field_2._M_allocated_capacity =
         local_590.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
    pcVar14 = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty
                        (local_570,(string *)local_4d8,&local_590);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._M_dataplus._M_p != &local_590.field_2) {
      operator_delete(local_590._M_dataplus._M_p,
                      (ulong)(local_590.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ != &local_4c8) {
      operator_delete((void *)local_4d8._0_8_,
                      CONCAT17(local_4c8._M_local_buf[7],
                               CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                        CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                 local_4c8._M_local_buf[0]))) + 1);
    }
    uVar3 = local_568._8_8_;
    if (pcVar14 != (char *)0x0) {
      strlen(pcVar14);
      std::__cxx11::string::_M_replace((ulong)local_568,0,(char *)uVar3,(ulong)pcVar14);
    }
    paVar28 = &local_590.field_2;
    local_4d8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_590._M_dataplus._M_p = (pointer)0x0;
    bVar4 = cmSystemTools::StringToULong(local_250._M_dataplus._M_p,(unsigned_long *)local_4d8);
    if ((bVar4) &&
       (bVar4 = cmSystemTools::StringToULong((char *)local_568._0_8_,(unsigned_long *)&local_590),
       bVar4)) {
      bVar4 = true;
      if ((ulong)local_4d8._0_8_ <
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x6) {
        bVar4 = (pointer)0x7 < local_590._M_dataplus._M_p &&
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d8._0_8_ ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x5;
      }
    }
    else {
      bVar4 = false;
    }
    if ((string *)local_568._0_8_ != (string *)(local_568 + 0x10)) {
      operator_delete((void *)local_568._0_8_,local_568._16_8_ + 1);
    }
    if (bVar4) {
      local_568._0_8_ = (string *)0x25;
      local_590._M_dataplus._M_p = (pointer)paVar28;
      local_590._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_590,(ulong)local_568);
      local_590.field_2._M_allocated_capacity = local_568._0_8_;
      builtin_strncpy(local_590._M_dataplus._M_p,"CMAKE_CXX_COMPILER_PREDEFINES_COMMAND",0x25);
      local_590._M_string_length = local_568._0_8_;
      local_590._M_dataplus._M_p[local_568._0_8_] = '\0';
      pcVar14 = cmMakefile::GetSafeDefinition(pcVar27,&local_590);
      std::__cxx11::string::string((string *)local_4d8,pcVar14,(allocator *)local_568);
      AddDefinitionEscaped(pcVar27,"_moc_predefs_cmd",(string *)local_4d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._0_8_ != &local_4c8) {
        operator_delete((void *)local_4d8._0_8_,
                        CONCAT17(local_4c8._M_local_buf[7],
                                 CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                          CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                   local_4c8._M_local_buf[0]))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_590._M_dataplus._M_p != paVar28) {
        operator_delete(local_590._M_dataplus._M_p,
                        (ulong)(local_590.field_2._M_allocated_capacity + 1));
      }
    }
    local_4d8._0_8_ = &local_4c8;
    local_4d8._8_8_ = (string *)0x0;
    local_4c8._M_local_buf[0] = '\0';
    local_590._M_string_length = 0;
    local_590.field_2._M_allocated_capacity =
         local_590.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_590._M_dataplus._M_p = (pointer)paVar28;
    local_4f0 = pcVar15;
    GetCompileDefinitionsAndDirectories(local_570,&local_1e8,(string *)local_4d8,&local_590);
    AddDefinitionEscaped(pcVar27,"_moc_incs",(string *)local_4d8);
    AddDefinitionEscaped(pcVar27,"_moc_compile_defs",&local_590);
    local_4e8 = pcVar27;
    if (local_2d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_2d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar23 = local_2d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_568._0_8_ = local_568 + 0x10;
        local_568._8_8_ = (string *)0x0;
        local_568._16_8_ = local_568._16_8_ & 0xffffffffffffff00;
        local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
        local_538._M_string_length = 0;
        local_538.field_2._M_local_buf[0] = '\0';
        GetCompileDefinitionsAndDirectories(local_570,pbVar23,(string *)local_568,&local_538);
        if ((local_568._8_8_ != local_4d8._8_8_) ||
           (((string *)local_568._8_8_ != (string *)0x0 &&
            (iVar7 = bcmp((void *)local_568._0_8_,(void *)local_4d8._0_8_,local_568._8_8_),
            iVar7 != 0)))) {
          cmOutputConverter::EscapeForCMake((string *)local_518,(string *)local_568);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_90,pbVar23);
          std::__cxx11::string::operator=((string *)pmVar12,(string *)local_518);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_518._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_518 + 0x10)) {
            operator_delete((void *)local_518._0_8_,local_518._16_8_ + 1);
          }
        }
        _Var26._M_p = local_538._M_dataplus._M_p;
        if ((local_538._M_string_length != local_590._M_string_length) ||
           (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_538._M_string_length !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0 &&
            (iVar7 = bcmp(local_538._M_dataplus._M_p,local_590._M_dataplus._M_p,
                          local_538._M_string_length), iVar7 != 0)))) {
          cmOutputConverter::EscapeForCMake((string *)local_518,&local_538);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_c0,pbVar23);
          std::__cxx11::string::operator=((string *)pmVar12,(string *)local_518);
          _Var26._M_p = local_538._M_dataplus._M_p;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_518._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_518 + 0x10)) {
            operator_delete((void *)local_518._0_8_,local_518._16_8_ + 1);
            _Var26._M_p = local_538._M_dataplus._M_p;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var26._M_p != &local_538.field_2) {
          operator_delete(_Var26._M_p,
                          CONCAT17(local_538.field_2._M_local_buf[7],
                                   CONCAT52(local_538.field_2._M_allocated_capacity._2_5_,
                                            CONCAT11(local_538.field_2._M_local_buf[1],
                                                     local_538.field_2._M_local_buf[0]))) + 1);
        }
        if ((string *)local_568._0_8_ != (string *)(local_568 + 0x10)) {
          operator_delete((void *)local_568._0_8_,local_568._16_8_ + 1);
        }
        pbVar23 = pbVar23 + 1;
      } while (pbVar23 !=
               local_2d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    paVar28 = &local_590.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._M_dataplus._M_p != paVar28) {
      operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
    }
    cVar25 = local_53b;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ != &local_4c8) {
      operator_delete((void *)local_4d8._0_8_,
                      CONCAT17(local_4c8._M_local_buf[7],
                               CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                        CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                 local_4c8._M_local_buf[0]))) + 1);
    }
    local_4d8._0_8_ = &local_4c8;
    local_4d8._8_8_ = (char *)0x0;
    local_4c8._M_local_buf[0] = '\0';
    iVar7 = std::__cxx11::string::compare((char *)&local_250);
    if (iVar7 == 0) {
      local_590.field_2._M_allocated_capacity = 0x636f6d3a3a357451;
      local_590._M_string_length = 8;
      local_590.field_2._M_local_buf[8] = '\0';
      local_590._M_dataplus._M_p = (pointer)paVar28;
      pcVar16 = cmLocalGenerator::FindGeneratorTargetToUse((cmLocalGenerator *)local_4f0,&local_590)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_590._M_dataplus._M_p != paVar28) {
        operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
      }
      if (pcVar16 == (cmGeneratorTarget *)0x0) {
        std::operator+(&local_590,"Qt5::moc target not found ",&local_1a8);
LAB_002f9189:
        std::__cxx11::string::operator=((string *)local_4d8,(string *)&local_590);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_590._M_dataplus._M_p != paVar28) {
          operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002f91b3;
      }
      local_590._M_string_length = 0;
      local_590.field_2._M_allocated_capacity =
           local_590.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_590._M_dataplus._M_p = (pointer)paVar28;
      pcVar14 = cmGeneratorTarget::ImportedGetLocation(pcVar16,&local_590);
LAB_002f9139:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_590._M_dataplus._M_p != paVar28) {
        operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)&local_250);
      if (iVar7 == 0) {
        local_590.field_2._M_allocated_capacity = 0x636f6d3a3a347451;
        local_590._M_string_length = 8;
        local_590.field_2._M_local_buf[8] = '\0';
        local_590._M_dataplus._M_p = (pointer)paVar28;
        pcVar16 = cmLocalGenerator::FindGeneratorTargetToUse
                            ((cmLocalGenerator *)local_4f0,&local_590);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_590._M_dataplus._M_p != paVar28) {
          operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
        }
        if (pcVar16 == (cmGeneratorTarget *)0x0) {
          std::operator+(&local_590,"Qt4::moc target not found ",&local_1a8);
          goto LAB_002f9189;
        }
        local_590._M_string_length = 0;
        local_590.field_2._M_allocated_capacity =
             local_590.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_590._M_dataplus._M_p = (pointer)paVar28;
        pcVar14 = cmGeneratorTarget::ImportedGetLocation(pcVar16,&local_590);
        goto LAB_002f9139;
      }
      std::__cxx11::string::_M_replace((ulong)local_4d8,0,(char *)local_4d8._8_8_,0x5b9c05);
      std::__cxx11::string::_M_append(local_4d8,(ulong)local_1a8._M_dataplus._M_p);
LAB_002f91b3:
      pcVar14 = (char *)0x0;
    }
    if ((char *)local_4d8._8_8_ == (char *)0x0) {
      pcVar19 = "";
      if (pcVar14 != (char *)0x0) {
        pcVar19 = pcVar14;
      }
      local_590._M_dataplus._M_p = (pointer)paVar28;
      sVar17 = strlen(pcVar19);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,pcVar19,pcVar19 + sVar17)
      ;
      AddDefinitionEscaped(local_4e8,"_qt_moc_executable",&local_590);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_590._M_dataplus._M_p != paVar28) {
        operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      cmSystemTools::Error((char *)local_4d8._0_8_,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ != &local_4c8) {
      operator_delete((void *)local_4d8._0_8_,
                      CONCAT17(local_4c8._M_local_buf[7],
                               CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                        CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                 local_4c8._M_local_buf[0]))) + 1);
    }
  }
  pcVar16 = local_570;
  if (cVar25 != '\0') {
    local_4e8 = (cmMakefile *)cmGeneratorTarget::GetLocalGenerator(local_570);
    pcVar27 = pcVar16->Target->Makefile;
    AddDefinitionEscaped(pcVar27,"_uic_skip",&local_228);
    local_568._0_8_ = (string *)0x0;
    local_568._8_8_ = (string *)0x0;
    local_568._16_8_ = 0;
    GetSafeProperty_abi_cxx11_((string *)local_4d8,pcVar16,"AUTOUIC_SEARCH_PATHS");
    cmSystemTools::ExpandListArgument
              ((string *)local_4d8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_568,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ != &local_4c8) {
      operator_delete((void *)local_4d8._0_8_,
                      CONCAT17(local_4c8._M_local_buf[7],
                               CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                        CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                 local_4c8._M_local_buf[0]))) + 1);
    }
    pcVar14 = cmMakefile::GetCurrentSourceDirectory(pcVar27);
    std::__cxx11::string::string((string *)local_4d8,pcVar14,(allocator *)&local_590);
    if (local_568._0_8_ != local_568._8_8_) {
      psVar13 = (string *)local_568._0_8_;
      do {
        cmsys::SystemTools::CollapseFullPath(&local_590,psVar13,(string *)local_4d8);
        std::__cxx11::string::operator=((string *)psVar13,(string *)&local_590);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_590._M_dataplus._M_p != &local_590.field_2) {
          operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
        }
        psVar13 = psVar13 + 1;
      } while (psVar13 != (string *)local_568._8_8_);
    }
    AddDefinitionEscaped
              (pcVar27,"_uic_search_paths",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_568);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ != &local_4c8) {
      operator_delete((void *)local_4d8._0_8_,
                      CONCAT17(local_4c8._M_local_buf[7],
                               CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                        CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                 local_4c8._M_local_buf[0]))) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_568);
    local_4d8._0_8_ = &local_4c8;
    local_4d8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_4c8._M_local_buf[0] = '\0';
    UicGetOpts(local_570,&local_1e8,(string *)local_4d8);
    AddDefinitionEscaped(pcVar27,"_uic_target_options",(string *)local_4d8);
    local_4f0 = pcVar27;
    if (local_2d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_2d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar23 = local_2d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_590._M_string_length = 0;
        local_590.field_2._M_allocated_capacity =
             local_590.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
        UicGetOpts(local_570,pbVar23,&local_590);
        _Var26._M_p = local_590._M_dataplus._M_p;
        if ((local_590._M_string_length != local_4d8._8_8_) ||
           (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_590._M_string_length !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0 &&
            (iVar7 = bcmp(local_590._M_dataplus._M_p,(void *)local_4d8._0_8_,
                          local_590._M_string_length), iVar7 != 0)))) {
          cmOutputConverter::EscapeForCMake((string *)local_568,&local_590);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_f0,pbVar23);
          std::__cxx11::string::operator=((string *)pmVar12,(string *)local_568);
          _Var26._M_p = local_590._M_dataplus._M_p;
          if ((string *)local_568._0_8_ != (string *)(local_568 + 0x10)) {
            operator_delete((void *)local_568._0_8_,local_568._16_8_ + 1);
            _Var26._M_p = local_590._M_dataplus._M_p;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var26._M_p != &local_590.field_2) {
          operator_delete(_Var26._M_p,local_590.field_2._M_allocated_capacity + 1);
        }
        pbVar23 = pbVar23 + 1;
      } while (pbVar23 !=
               local_2d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ != &local_4c8) {
      operator_delete((void *)local_4d8._0_8_,
                      CONCAT17(local_4c8._M_local_buf[7],
                               CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                        CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                 local_4c8._M_local_buf[0]))) + 1);
    }
    pbVar23 = local_228.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pcVar27 = local_4f0;
    local_518._16_8_ = 0;
    local_518._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_518._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __position._M_node = (_Base_ptr)(local_4d8 + 8);
    local_4d8._8_8_ = local_4d8._8_8_ & 0xffffffff00000000;
    local_4c8._M_local_buf[0] = '\0';
    local_4c8._M_allocated_capacity._1_2_ = 0;
    local_4c8._M_allocated_capacity._3_4_ = 0;
    local_4c8._M_local_buf[7] = '\0';
    local_4c8._M_local_buf[8] = (char)__position._M_node;
    local_4c8._M_local_buf[9] = (char)((ulong)__position._M_node >> 8);
    local_4c8._10_2_ = (undefined2)((ulong)__position._M_node >> 0x10);
    local_4c8._M_local_buf[0xc] = (char)((ulong)__position._M_node >> 0x20);
    local_4c8._13_2_ = (undefined2)((ulong)__position._M_node >> 0x28);
    local_4c8._M_local_buf[0xf] = (char)((ulong)__position._M_node >> 0x38);
    local_4b0 = 0;
    local_590._M_dataplus._M_p = local_4d8;
    local_4b8 = __position._M_node;
    if (local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __v = local_228.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_unique_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_4d8,__position,__v,(_Alloc_node *)&local_590);
        __v = __v + 1;
      } while (__v != pbVar23);
    }
    cmMakefile::GetQtUiFilesWithOptions(&local_298,pcVar27);
    if (local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ppcVar29 = local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar1 = *ppcVar29;
        psVar13 = cmSourceFile::GetFullPath(pcVar1,(string *)0x0);
        cmsys::SystemTools::GetRealPath(&local_590,psVar13,(string *)0x0);
        pVar30 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)local_4d8,&local_590);
        if (((undefined1  [16])pVar30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_518,&local_590);
          local_538.field_2._8_7_ = 0x534e4f4954504f;
          local_538.field_2._M_local_buf[0] = 'A';
          local_538.field_2._M_local_buf[1] = 'U';
          local_538.field_2._M_allocated_capacity._2_5_ = 0x4349554f54;
          local_538.field_2._M_local_buf[7] = '_';
          local_538._M_string_length = 0xf;
          local_538.field_2._M_local_buf[0xf] = '\0';
          local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
          pcVar14 = cmSourceFile::GetProperty(pcVar1,&local_538);
          std::__cxx11::string::string((string *)local_568,pcVar14,(allocator *)&local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p != &local_538.field_2) {
            operator_delete(local_538._M_dataplus._M_p,
                            CONCAT17(local_538.field_2._M_local_buf[7],
                                     CONCAT52(local_538.field_2._M_allocated_capacity._2_5_,
                                              CONCAT11(local_538.field_2._M_local_buf[1],
                                                       local_538.field_2._M_local_buf[0]))) + 1);
          }
          cmsys::SystemTools::ReplaceString
                    ((string *)local_568,";",cmQtAutoGeneratorCommon::listSep);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_278,(string *)local_568);
          if ((string *)local_568._0_8_ != (string *)(local_568 + 0x10)) {
            operator_delete((void *)local_568._0_8_,local_568._16_8_ + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_590._M_dataplus._M_p != &local_590.field_2) {
          operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
        }
        ppcVar29 = ppcVar29 + 1;
        pcVar27 = local_4f0;
      } while (ppcVar29 !=
               local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
               .super__Vector_impl_data._M_finish);
    }
    if (local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_298.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_298.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_4d8);
    AddDefinitionEscaped
              (pcVar27,"_qt_uic_options_files",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_518);
    AddDefinitionEscaped(pcVar27,"_qt_uic_options_options",&local_278);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_278);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_518);
    local_4d8._0_8_ = &local_4c8;
    local_4d8._8_8_ = (char *)0x0;
    local_4c8._M_local_buf[0] = '\0';
    iVar7 = std::__cxx11::string::compare((char *)&local_250);
    if (iVar7 == 0) {
      paVar28 = &local_590.field_2;
      local_590.field_2._M_allocated_capacity = 0x6369753a3a357451;
      local_590._M_string_length = 8;
      local_590.field_2._M_local_buf[8] = '\0';
      local_590._M_dataplus._M_p = (pointer)paVar28;
      pcVar16 = cmLocalGenerator::FindGeneratorTargetToUse((cmLocalGenerator *)local_4e8,&local_590)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_590._M_dataplus._M_p != paVar28) {
        operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
      }
      if (pcVar16 == (cmGeneratorTarget *)0x0) goto LAB_002f995b;
      local_590._M_string_length = 0;
      local_590.field_2._M_allocated_capacity =
           local_590.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_590._M_dataplus._M_p = (pointer)paVar28;
      pcVar14 = cmGeneratorTarget::ImportedGetLocation(pcVar16,&local_590);
LAB_002f98f7:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_590._M_dataplus._M_p != &local_590.field_2) {
        operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)&local_250);
      if (iVar7 == 0) {
        paVar28 = &local_590.field_2;
        local_590.field_2._M_allocated_capacity = 0x6369753a3a347451;
        local_590._M_string_length = 8;
        local_590.field_2._M_local_buf[8] = '\0';
        local_590._M_dataplus._M_p = (pointer)paVar28;
        pcVar16 = cmLocalGenerator::FindGeneratorTargetToUse
                            ((cmLocalGenerator *)local_4e8,&local_590);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_590._M_dataplus._M_p != paVar28) {
          operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
        }
        if (pcVar16 != (cmGeneratorTarget *)0x0) {
          local_590._M_string_length = 0;
          local_590.field_2._M_allocated_capacity =
               local_590.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_590._M_dataplus._M_p = (pointer)paVar28;
          pcVar14 = cmGeneratorTarget::ImportedGetLocation(pcVar16,&local_590);
          goto LAB_002f98f7;
        }
        psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(local_570);
        std::operator+(&local_590,"Qt4::uic target not found ",psVar13);
        std::__cxx11::string::operator=((string *)local_4d8,(string *)&local_590);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_590._M_dataplus._M_p != paVar28) {
          operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::string::_M_replace((ulong)local_4d8,0,(char *)local_4d8._8_8_,0x5b9d15);
        psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(local_570);
        std::__cxx11::string::_M_append(local_4d8,(ulong)(psVar13->_M_dataplus)._M_p);
      }
LAB_002f995b:
      pcVar14 = (char *)0x0;
    }
    if ((char *)local_4d8._8_8_ == (char *)0x0) {
      pcVar19 = "";
      if (pcVar14 != (char *)0x0) {
        pcVar19 = pcVar14;
      }
      local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
      sVar17 = strlen(pcVar19);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,pcVar19,pcVar19 + sVar17)
      ;
      AddDefinitionEscaped(pcVar27,"_qt_uic_executable",&local_590);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_590._M_dataplus._M_p != &local_590.field_2) {
        operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      cmSystemTools::Error((char *)local_4d8._0_8_,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ != &local_4c8) {
      operator_delete((void *)local_4d8._0_8_,
                      CONCAT17(local_4c8._M_local_buf[7],
                               CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                        CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                 local_4c8._M_local_buf[0]))) + 1);
    }
  }
  pcVar16 = local_570;
  if (local_53a != 0) {
    pcVar27 = local_570->Target->Makefile;
    uVar10 = std::__cxx11::string::compare((char *)&local_250);
    local_4f0 = (cmMakefile *)CONCAT44(local_4f0._4_4_,uVar10);
    RccGetExecutable(&local_590,pcVar16,&local_250);
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_128.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_128.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_128.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4c8._M_local_buf[0] = 'A';
    local_4c8._M_allocated_capacity._1_2_ = 0x5455;
    local_4c8._M_allocated_capacity._3_4_ = 0x4343524f;
    local_4c8._M_local_buf[7] = '_';
    local_4c8._M_local_buf[8] = 'O';
    local_4c8._M_local_buf[9] = 'P';
    local_4c8._10_2_ = 0x4954;
    local_4c8._M_local_buf[0xc] = 'O';
    local_4c8._13_2_ = 0x534e;
    local_4d8._8_8_ = (char *)0xf;
    local_4c8._M_local_buf[0xf] = '\0';
    local_4d8._0_8_ = &local_4c8;
    pcVar14 = cmGeneratorTarget::GetProperty(pcVar16,(string *)local_4d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ != &local_4c8) {
      operator_delete((void *)local_4d8._0_8_,
                      CONCAT17(local_4c8._M_local_buf[7],
                               CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                        CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                 local_4c8._M_local_buf[0]))) + 1);
    }
    if (pcVar14 != (char *)0x0) {
      local_4d8._0_8_ = &local_4c8;
      sVar17 = strlen(pcVar14);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,pcVar14,pcVar14 + sVar17);
      cmSystemTools::ExpandListArgument((string *)local_4d8,&local_128,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._0_8_ != &local_4c8) {
        operator_delete((void *)local_4d8._0_8_,
                        CONCAT17(local_4c8._M_local_buf[7],
                                 CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                          CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                   local_4c8._M_local_buf[0]))) + 1);
      }
    }
    local_208.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_208.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmGeneratorTarget::GetConfigCommonSourceFiles(local_570,&local_208);
    local_4e8 = pcVar27;
    if (local_208.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_208.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ppcVar29 = local_208.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar1 = *ppcVar29;
        psVar13 = cmSourceFile::GetExtension_abi_cxx11_(pcVar1);
        iVar7 = std::__cxx11::string::compare((char *)psVar13);
        if (iVar7 == 0) {
          local_4d8._0_8_ = &local_4c8;
          local_4c8._M_local_buf[0] = 'S';
          local_4c8._M_allocated_capacity._1_2_ = 0x494b;
          local_4c8._M_allocated_capacity._3_4_ = 0x55415f50;
          local_4c8._M_local_buf[7] = 'T';
          local_4c8._M_local_buf[8] = 'O';
          local_4c8._M_local_buf[9] = 'G';
          local_4c8._10_2_ = 0x4e45;
          local_4d8._8_8_ = (char *)0xc;
          local_4c8._M_local_buf[0xc] = '\0';
          pcVar14 = cmSourceFile::GetPropertyForUser(pcVar1,(string *)local_4d8);
          bVar4 = cmSystemTools::IsOn(pcVar14);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._0_8_ != &local_4c8) {
            operator_delete((void *)local_4d8._0_8_,
                            CONCAT17(local_4c8._M_local_buf[7],
                                     CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                              CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                       local_4c8._M_local_buf[0]))) + 1);
          }
          if (!bVar4) {
            local_4d8._0_8_ = &local_4c8;
            local_4c8._M_local_buf[0] = 'S';
            local_4c8._M_allocated_capacity._1_2_ = 0x494b;
            local_4c8._M_allocated_capacity._3_4_ = 0x55415f50;
            local_4c8._M_local_buf[7] = 'T';
            local_4c8._M_local_buf[8] = 'O';
            local_4c8._M_local_buf[9] = 'R';
            local_4c8._10_2_ = 0x4343;
            local_4d8._8_8_ = (char *)0xc;
            local_4c8._M_local_buf[0xc] = '\0';
            pcVar14 = cmSourceFile::GetPropertyForUser(pcVar1,(string *)local_4d8);
            bVar4 = cmSystemTools::IsOn(pcVar14);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d8._0_8_ != &local_4c8) {
              operator_delete((void *)local_4d8._0_8_,
                              CONCAT17(local_4c8._M_local_buf[7],
                                       CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                                CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                         local_4c8._M_local_buf[0]))) + 1);
            }
            if (!bVar4) {
              psVar13 = cmSourceFile::GetFullPath(pcVar1,(string *)0x0);
              cmsys::SystemTools::GetRealPath((string *)local_568,psVar13,(string *)0x0);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_278,(string *)local_568);
              local_538.field_2._M_local_buf[0] = '{';
              local_538.field_2._M_local_buf[1] = '\0';
              local_538._M_string_length = 1;
              local_4d8._0_8_ = &local_4c8;
              local_4c8._M_local_buf[0] = 'G';
              local_4c8._M_allocated_capacity._1_2_ = 0x4e45;
              local_4c8._M_allocated_capacity._3_4_ = 0x54415245;
              local_4c8._M_local_buf[7] = 'E';
              local_4c8._M_local_buf[8] = 'D';
              local_4d8._8_8_ = 9;
              local_4c8._M_local_buf[9] = '\0';
              local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
              pcVar14 = cmSourceFile::GetPropertyForUser(pcVar1,(string *)local_4d8);
              bVar4 = cmSystemTools::IsOn(pcVar14);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d8._0_8_ != &local_4c8) {
                operator_delete((void *)local_4d8._0_8_,
                                CONCAT17(local_4c8._M_local_buf[7],
                                         CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                                  CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                           local_4c8._M_local_buf[0]))) + 1);
              }
              if (!bVar4) {
                local_4d8._0_8_ = &local_4c8;
                local_4d8._8_8_ = 0;
                local_4c8._M_local_buf[0] = '\0';
                local_2b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_2b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
                local_2b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
                bVar4 = cmQtAutoGeneratorCommon::RccListInputs
                                  (&local_250,&local_590,(string *)local_568,&local_2b8,
                                   (string *)local_4d8);
                if (bVar4) {
                  cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            ((string *)local_518,&local_2b8,cmQtAutoGeneratorCommon::listSep);
                  std::__cxx11::string::_M_append((char *)&local_538,local_518._0_8_);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_518._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_518 + 0x10)) {
                    operator_delete((void *)local_518._0_8_,local_518._16_8_ + 1);
                  }
                }
                else {
                  cmSystemTools::Error((char *)local_4d8._0_8_,(char *)0x0,(char *)0x0,(char *)0x0);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_2b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4d8._0_8_ != &local_4c8) {
                  operator_delete((void *)local_4d8._0_8_,
                                  CONCAT17(local_4c8._M_local_buf[7],
                                           CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                                    CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                             local_4c8._M_local_buf[0]))) + 1);
                }
              }
              std::__cxx11::string::append((char *)&local_538);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_298,&local_538);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_538._M_dataplus._M_p != &local_538.field_2) {
                operator_delete(local_538._M_dataplus._M_p,
                                CONCAT17(local_538.field_2._M_local_buf[7],
                                         CONCAT52(local_538.field_2._M_allocated_capacity._2_5_,
                                                  CONCAT11(local_538.field_2._M_local_buf[1],
                                                           local_538.field_2._M_local_buf[0]))) + 1)
                ;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_518,&local_128);
              local_4c8._M_local_buf[8] = 'O';
              local_4c8._M_local_buf[9] = 'P';
              local_4c8._10_2_ = 0x4954;
              local_4c8._M_local_buf[0xc] = 'O';
              local_4c8._13_2_ = 0x534e;
              local_4c8._M_local_buf[0] = 'A';
              local_4c8._M_allocated_capacity._1_2_ = 0x5455;
              local_4c8._M_allocated_capacity._3_4_ = 0x4343524f;
              local_4c8._M_local_buf[7] = '_';
              local_4d8._8_8_ = (char *)0xf;
              local_4c8._M_local_buf[0xf] = '\0';
              local_4d8._0_8_ = &local_4c8;
              pcVar14 = cmSourceFile::GetProperty(pcVar1,(string *)local_4d8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d8._0_8_ != &local_4c8) {
                operator_delete((void *)local_4d8._0_8_,
                                CONCAT17(local_4c8._M_local_buf[7],
                                         CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                                  CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                           local_4c8._M_local_buf[0]))) + 1);
              }
              if (pcVar14 != (char *)0x0) {
                local_2b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
                local_2b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
                local_2b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_4d8._0_8_ = &local_4c8;
                sVar17 = strlen(pcVar14);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_4d8,pcVar14,pcVar14 + sVar17);
                cmSystemTools::ExpandListArgument((string *)local_4d8,&local_2b8,false);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4d8._0_8_ != &local_4c8) {
                  operator_delete((void *)local_4d8._0_8_,
                                  CONCAT17(local_4c8._M_local_buf[7],
                                           CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                                    CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                             local_4c8._M_local_buf[0]))) + 1);
                }
                local_538._M_dataplus._M_p = (pointer)0x0;
                local_538._M_string_length = 0;
                local_538.field_2._M_local_buf[0] = '\0';
                local_538.field_2._M_local_buf[1] = '\0';
                local_538.field_2._M_allocated_capacity._2_5_ = 0;
                local_538.field_2._M_local_buf[7] = '\0';
                __x = local_2b8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
                if (local_2b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                    local_2b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  do {
                    _Var18 = std::
                             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                       (local_518._0_8_,local_518._8_8_,__x);
                    if (_Var18._M_current ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_518._8_8_) {
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&local_538,__x);
                    }
                    else {
                      pcVar14 = (__x->_M_dataplus)._M_p;
                      if (*pcVar14 == '-') {
                        pcVar19 = pcVar14 + 1;
                        if (((int)local_4f0 == 0) && (pcVar14[1] == '-')) {
                          pcVar19 = pcVar14 + 2;
                        }
                        local_4d8._0_8_ = &local_4c8;
                        sVar17 = strlen(pcVar19);
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_4d8,pcVar19,pcVar19 + sVar17);
                        ppcVar20 = std::find_if<char_const*const*,cmStrCmp>
                                             ((char **)
                                                  RccMergeOptions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)
                                                  ::valueOptions,cmCacheEntryTypes,
                                              (cmStrCmp *)local_4d8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_4d8._0_8_ != &local_4c8) {
                          operator_delete((void *)local_4d8._0_8_,
                                          CONCAT17(local_4c8._M_local_buf[7],
                                                   CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                                            CONCAT21(local_4c8._M_allocated_capacity
                                                                     ._1_2_,local_4c8._M_local_buf
                                                                            [0]))) + 1);
                        }
                        if (((ppcVar20 != cmCacheEntryTypes) &&
                            (_Var18._M_current + 1 !=
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_518._8_8_)) &&
                           (__x + 1 !=
                            local_2b8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish)) {
                          std::__cxx11::string::_M_assign((string *)(_Var18._M_current + 1));
                          __x = __x + 1;
                        }
                      }
                    }
                    __x = __x + 1;
                  } while (__x != local_2b8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish);
                }
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           local_518,local_518._8_8_,local_538._M_dataplus._M_p,
                           local_538._M_string_length);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_538);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_2b8);
              }
              if (local_518._0_8_ != local_518._8_8_) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_1c8,(value_type *)local_568);
                cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((string *)local_4d8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_518,cmQtAutoGeneratorCommon::listSep);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_108,(string *)local_4d8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4d8._0_8_ != &local_4c8) {
                  operator_delete((void *)local_4d8._0_8_,
                                  CONCAT17(local_4c8._M_local_buf[7],
                                           CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                                    CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                             local_4c8._M_local_buf[0]))) + 1);
                }
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_518);
              if ((string *)local_568._0_8_ != (string *)(local_568 + 0x10)) {
                operator_delete((void *)local_568._0_8_,local_568._16_8_ + 1);
              }
            }
          }
        }
        ppcVar29 = ppcVar29 + 1;
      } while (ppcVar29 !=
               local_208.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
               .super__Vector_impl_data._M_finish);
    }
    pcVar27 = local_4e8;
    AddDefinitionEscaped(local_4e8,"_qt_rcc_executable",&local_590);
    AddDefinitionEscaped(pcVar27,"_rcc_files",&local_278);
    AddDefinitionEscaped
              (pcVar27,"_rcc_inputs",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_298);
    AddDefinitionEscaped(pcVar27,"_rcc_options_files",&local_1c8);
    AddDefinitionEscaped(pcVar27,"_rcc_options_options",&local_108);
    if (local_208.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_208.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_208.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_208.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_128);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_108);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_298);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._M_dataplus._M_p != &local_590.field_2) {
      operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
LAB_002fa2ed:
  GetAutogenTargetBuildDir_abi_cxx11_((string *)local_4d8,local_570);
  AddDefinitionEscaped(local_4e0,"_autogen_build_dir",(string *)local_4d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._0_8_ != &local_4c8) {
    operator_delete((void *)local_4d8._0_8_,
                    CONCAT17(local_4c8._M_local_buf[7],
                             CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                      CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                               local_4c8._M_local_buf[0]))) + 1);
  }
  pcVar27 = local_4e0;
  AddDefinitionEscaped(local_4e0,"_qt_version_major",&local_250);
  AddDefinitionEscaped(pcVar27,"_sources",&local_148);
  AddDefinitionEscaped(pcVar27,"_headers",&local_168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  GetAutogenTargetFilesDir_abi_cxx11_(&local_590,local_570);
  std::__cxx11::string::append((char *)&local_590);
  psVar13 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  local_4d8._0_8_ = &local_4c8;
  pcVar2 = (psVar13->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4d8,pcVar2,pcVar2 + psVar13->_M_string_length);
  std::__cxx11::string::append(local_4d8);
  uVar3 = local_4d8._0_8_;
  _Var26._M_p = local_590._M_dataplus._M_p;
  cmNewLineStyle::cmNewLineStyle(&local_254);
  cmMakefile::ConfigureFile(local_4e0,(char *)uVar3,_Var26._M_p,false,true,false,local_254);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._0_8_ != &local_4c8) {
    operator_delete((void *)local_4d8._0_8_,
                    CONCAT17(local_4c8._M_local_buf[7],
                             CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                      CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                               local_4c8._M_local_buf[0]))) + 1);
  }
  if (((local_60._M_impl.super__Rb_tree_header._M_node_count != 0) ||
      (local_c0._M_impl.super__Rb_tree_header._M_node_count != 0)) ||
     ((local_90._M_impl.super__Rb_tree_header._M_node_count != 0 ||
      (local_f0._M_impl.super__Rb_tree_header._M_node_count != 0)))) {
    local_518._0_8_ = local_518._0_8_ & 0xffffffff00000000;
    cmsys::SystemTools::GetPermissions(&local_590,(mode_t *)local_518);
    if (-1 < (char)local_518._0_8_) {
      cmsys::SystemTools::SetPermissions(&local_590,local_518._0_4_ | 0x80,false);
    }
    std::ofstream::ofstream(local_4d8,local_590._M_dataplus._M_p,_S_app);
    if ((*(byte *)((long)&local_4b8 + *(long *)(local_4d8._0_8_ - 0x18)) & 5) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4d8,"# Configuration specific options\n",0x21);
      if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_60._M_impl.super__Rb_tree_header) {
        p_Var22 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4d8,"set(AM_CONFIG_SUFFIX_",0x15);
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4d8,*(char **)(p_Var22 + 1),
                               (long)p_Var22[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21," ",1);
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar21,*(char **)(p_Var22 + 2),(long)p_Var22[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,")\n",2);
          p_Var22 = (_Base_ptr)std::_Rb_tree_increment(p_Var22);
        } while ((_Rb_tree_header *)p_Var22 != &local_60._M_impl.super__Rb_tree_header);
      }
      if ((_Rb_tree_header *)local_c0._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_c0._M_impl.super__Rb_tree_header) {
        p_Var22 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4d8,"set(AM_MOC_DEFINITIONS_",0x17);
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4d8,*(char **)(p_Var22 + 1),
                               (long)p_Var22[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21," ",1);
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar21,*(char **)(p_Var22 + 2),(long)p_Var22[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,")\n",2);
          p_Var22 = (_Base_ptr)std::_Rb_tree_increment(p_Var22);
        } while ((_Rb_tree_header *)p_Var22 != &local_c0._M_impl.super__Rb_tree_header);
      }
      if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_90._M_impl.super__Rb_tree_header) {
        p_Var22 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4d8,"set(AM_MOC_INCLUDES_",0x14);
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4d8,*(char **)(p_Var22 + 1),
                               (long)p_Var22[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21," ",1);
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar21,*(char **)(p_Var22 + 2),(long)p_Var22[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,")\n",2);
          p_Var22 = (_Base_ptr)std::_Rb_tree_increment(p_Var22);
        } while ((_Rb_tree_header *)p_Var22 != &local_90._M_impl.super__Rb_tree_header);
      }
      if ((_Rb_tree_header *)local_f0._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_f0._M_impl.super__Rb_tree_header) {
        p_Var22 = local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4d8,"set(AM_UIC_TARGET_OPTIONS_",0x1a);
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4d8,*(char **)(p_Var22 + 1),
                               (long)p_Var22[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21," ",1);
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar21,*(char **)(p_Var22 + 2),(long)p_Var22[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,")\n",2);
          p_Var22 = (_Base_ptr)std::_Rb_tree_increment(p_Var22);
        } while ((_Rb_tree_header *)p_Var22 != &local_f0._M_impl.super__Rb_tree_header);
      }
    }
    else {
      local_568._0_8_ = (string *)(local_568 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_568,"Internal CMake error when trying to open file: ","");
      cmQtAutoGeneratorCommon::Quoted(&local_538,&local_590);
      std::__cxx11::string::_M_append(local_568,(ulong)local_538._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_538._M_dataplus._M_p != &local_538.field_2) {
        operator_delete(local_538._M_dataplus._M_p,
                        CONCAT17(local_538.field_2._M_local_buf[7],
                                 CONCAT52(local_538.field_2._M_allocated_capacity._2_5_,
                                          CONCAT11(local_538.field_2._M_local_buf[1],
                                                   local_538.field_2._M_local_buf[0]))) + 1);
      }
      std::__cxx11::string::append(local_568);
      cmSystemTools::Error((char *)local_568._0_8_,(char *)0x0,(char *)0x0,(char *)0x0);
      if ((string *)local_568._0_8_ != (string *)(local_568 + 0x10)) {
        operator_delete((void *)local_568._0_8_,local_568._16_8_ + 1);
      }
    }
    local_4d8._0_8_ = _VTT;
    *(undefined8 *)(local_4d8 + *(long *)(_VTT->_M_local_buf + -0x18)) = _vtable;
    std::filebuf::~filebuf((filebuf *)(local_4d8 + 8));
    std::ios_base::~ios_base(local_3e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_f0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                             local_1e8.field_2._M_local_buf[0]) + 1);
  }
  cmMakefile::PopScope(local_4e0);
  return;
}

Assistant:

void cmQtAutoGeneratorInitializer::SetupAutoGenerateTarget(
  cmGeneratorTarget const* target)
{
  cmMakefile* makefile = target->Target->GetMakefile();

  // forget the variables added here afterwards again:
  cmMakefile::ScopePushPop varScope(makefile);
  static_cast<void>(varScope);

  // Get configurations
  std::string config;
  const std::vector<std::string> configs(GetConfigurations(makefile, &config));

  // Configurations settings buffers
  std::map<std::string, std::string> configSuffix;
  std::map<std::string, std::string> configMocIncludes;
  std::map<std::string, std::string> configMocDefines;
  std::map<std::string, std::string> configUicOptions;

  // Configuration suffix
  if (IsMultiConfig(target->GetGlobalGenerator())) {
    for (std::vector<std::string>::const_iterator it = configs.begin();
         it != configs.end(); ++it) {
      configSuffix[*it] = cmOutputConverter::EscapeForCMake("_" + *it);
    }
  }

  // Basic setup
  {
    const bool mocEnabled = target->GetPropertyAsBool("AUTOMOC");
    const bool uicEnabled = target->GetPropertyAsBool("AUTOUIC");
    const bool rccEnabled = target->GetPropertyAsBool("AUTORCC");
    const std::string autogenTargetName = GetAutogenTargetName(target);
    const std::string qtMajorVersion = GetQtMajorVersion(target);

    std::vector<std::string> sources;
    std::vector<std::string> headers;

    if (mocEnabled || uicEnabled || rccEnabled) {
      std::vector<std::string> mocSkipList;
      std::vector<std::string> uicSkipList;
      AcquireScanFiles(target, sources, headers, mocSkipList, uicSkipList);
      if (mocEnabled) {
        MocSetupAutoTarget(target, autogenTargetName, qtMajorVersion, config,
                           configs, mocSkipList, configMocIncludes,
                           configMocDefines);
      }
      if (uicEnabled) {
        UicSetupAutoTarget(target, qtMajorVersion, config, configs,
                           uicSkipList, configUicOptions);
      }
      if (rccEnabled) {
        RccSetupAutoTarget(target, qtMajorVersion);
      }
    }

    AddDefinitionEscaped(makefile, "_autogen_build_dir",
                         GetAutogenTargetBuildDir(target));
    AddDefinitionEscaped(makefile, "_qt_version_major", qtMajorVersion);
    AddDefinitionEscaped(makefile, "_sources", sources);
    AddDefinitionEscaped(makefile, "_headers", headers);
  }

  // Generate info file
  std::string infoFile = GetAutogenTargetFilesDir(target);
  infoFile += "/AutogenInfo.cmake";
  {
    std::string inf = cmSystemTools::GetCMakeRoot();
    inf += "/Modules/AutogenInfo.cmake.in";
    makefile->ConfigureFile(inf.c_str(), infoFile.c_str(), false, true, false);
  }

  // Append custom definitions to info file on demand
  if (!configSuffix.empty() || !configMocDefines.empty() ||
      !configMocIncludes.empty() || !configUicOptions.empty()) {

    // Ensure we have write permission in case .in was read-only.
    mode_t perm = 0;
#if defined(_WIN32) && !defined(__CYGWIN__)
    mode_t mode_write = S_IWRITE;
#else
    mode_t mode_write = S_IWUSR;
#endif
    cmSystemTools::GetPermissions(infoFile, perm);
    if (!(perm & mode_write)) {
      cmSystemTools::SetPermissions(infoFile, perm | mode_write);
    }

    // Open and write file
    cmsys::ofstream ofs(infoFile.c_str(), std::ios::app);
    if (ofs) {
      ofs << "# Configuration specific options\n";
      for (std::map<std::string, std::string>::iterator
             it = configSuffix.begin(),
             end = configSuffix.end();
           it != end; ++it) {
        ofs << "set(AM_CONFIG_SUFFIX_" << it->first << " " << it->second
            << ")\n";
      }
      for (std::map<std::string, std::string>::iterator
             it = configMocDefines.begin(),
             end = configMocDefines.end();
           it != end; ++it) {
        ofs << "set(AM_MOC_DEFINITIONS_" << it->first << " " << it->second
            << ")\n";
      }
      for (std::map<std::string, std::string>::iterator
             it = configMocIncludes.begin(),
             end = configMocIncludes.end();
           it != end; ++it) {
        ofs << "set(AM_MOC_INCLUDES_" << it->first << " " << it->second
            << ")\n";
      }
      for (std::map<std::string, std::string>::iterator
             it = configUicOptions.begin(),
             end = configUicOptions.end();
           it != end; ++it) {
        ofs << "set(AM_UIC_TARGET_OPTIONS_" << it->first << " " << it->second
            << ")\n";
      }
    } else {
      // File open error
      std::string error = "Internal CMake error when trying to open file: ";
      error += cmQtAutoGeneratorCommon::Quoted(infoFile);
      error += " for writing.";
      cmSystemTools::Error(error.c_str());
    }
  }
}